

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O2

UINT8 DecompressDataBlk(UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,
                       PCM_CMP_INF *cmprInfo)

{
  byte bVar1;
  UINT8 UVar2;
  UINT16 UVar3;
  PCM_COMPR_TBL *pPVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  ushort uVar11;
  short sVar12;
  ulong uVar13;
  UINT8 *pUVar14;
  UINT8 *pUVar15;
  short *psVar16;
  ushort uVar17;
  ulong uVar18;
  ushort uVar19;
  ushort uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  
  if (cmprInfo->comprType == '\x01') {
    bVar8 = cmprInfo->bitsDec;
    uVar6 = bVar8 + 7 >> 3;
    if (uVar6 == 2) {
      pPVar4 = cmprInfo->comprTbl;
      if (pPVar4->valueCount != 0) {
        if (bVar8 != pPVar4->bitsDec) {
          return '\x11';
        }
        bVar1 = cmprInfo->bitsCmp;
        if (bVar1 != pPVar4->bitsCmp) {
          return '\x11';
        }
        pUVar15 = (pPVar4->values).d8;
        uVar6 = 0;
        uVar18 = ((ulong)inLen << 4) / (ulong)bVar1;
        uVar13 = (ulong)outLen;
        if ((uint)uVar18 < outLen) {
          uVar13 = uVar18;
        }
        pUVar14 = outData + (uVar13 & 0xffffffff);
        uVar22 = (uint)cmprInfo->baseVal;
        for (; uVar18 = 0, outData < pUVar14; outData = outData + 2) {
          uVar10 = 0;
          uVar13 = (ulong)bVar1;
          while( true ) {
            uVar21 = (uint)uVar13 & 0xffff;
            if ((uVar13 & 0xffff) == 0) break;
            uVar7 = 8;
            if (uVar21 < 8) {
              uVar7 = uVar21;
            }
            uVar6 = uVar6 + uVar7;
            uVar23 = (uint)*inData << ((byte)uVar6 & 0x1f);
            if (7 < (ushort)uVar6) {
              inData = inData + 1;
              uVar19 = (ushort)uVar6 - 8;
              uVar6 = (uint)uVar19;
              if (uVar19 == 0) {
                uVar6 = 0;
              }
              else {
                uVar23 = uVar23 | (uint)*inData << ((byte)uVar19 & 0x1f);
              }
            }
            uVar13 = (ulong)(uVar21 - uVar7);
            uVar18 = (ulong)((uint)uVar18 |
                            (uVar23 >> 8 & ~(-1 << ((byte)uVar7 & 0x1f))) << ((byte)uVar10 & 0x1f));
            uVar10 = (uVar10 & 0xffff) + uVar7;
          }
          uVar22 = uVar22 + *(ushort *)(pUVar15 + uVar18 * 2) & (-1 << (bVar8 & 0x1f) ^ 0xffffU);
          *(short *)outData = (short)uVar22;
        }
        return '\0';
      }
    }
    else {
      if (uVar6 != 1) {
        return ' ';
      }
      pPVar4 = cmprInfo->comprTbl;
      if (pPVar4->valueCount != 0) {
        if (bVar8 != pPVar4->bitsDec) {
          return '\x11';
        }
        bVar1 = cmprInfo->bitsCmp;
        if (bVar1 != pPVar4->bitsCmp) {
          return '\x11';
        }
        pUVar15 = (pPVar4->values).d8;
        uVar6 = 0;
        uVar18 = ((ulong)inLen << 3) / (ulong)bVar1;
        uVar13 = (ulong)outLen;
        if ((uint)uVar18 < outLen) {
          uVar13 = uVar18;
        }
        pUVar14 = outData + (uVar13 & 0xffffffff);
        uVar22 = (uint)cmprInfo->baseVal;
        for (; uVar10 = 0, outData < pUVar14; outData = outData + 1) {
          uVar13 = 0;
          uVar18 = (ulong)bVar1;
          while (uVar21 = (uint)uVar18 & 0xffff, (uVar18 & 0xffff) != 0) {
            uVar7 = 8;
            if (uVar21 < 8) {
              uVar7 = uVar21;
            }
            uVar6 = uVar6 + uVar7;
            uVar23 = (uint)*inData << ((byte)uVar6 & 0x1f);
            if (7 < (ushort)uVar6) {
              inData = inData + 1;
              uVar19 = (ushort)uVar6 - 8;
              uVar6 = (uint)uVar19;
              if (uVar19 == 0) {
                uVar6 = 0;
              }
              else {
                uVar23 = uVar23 | (uint)*inData << ((byte)uVar19 & 0x1f);
              }
            }
            uVar13 = (ulong)((uint)uVar13 |
                            (uVar23 >> 8 & ~(-1 << ((byte)uVar7 & 0x1f))) << ((byte)uVar10 & 0x1f));
            uVar10 = (uVar10 & 0xffff) + uVar7;
            uVar18 = (ulong)(uVar21 - uVar7);
          }
          uVar22 = uVar22 + pUVar15[uVar13 & 0xffff] & ~(-1 << (bVar8 & 0x1f));
          *outData = (UINT8)uVar22;
        }
        return '\0';
      }
    }
  }
  else {
    if (cmprInfo->comprType != '\0') {
      return 0x80;
    }
    bVar8 = cmprInfo->bitsDec;
    uVar6 = bVar8 + 7 >> 3;
    if (uVar6 == 2) {
      UVar2 = cmprInfo->subType;
      bVar1 = cmprInfo->bitsCmp;
      uVar19 = (ushort)bVar1;
      if (UVar2 != '\x02') {
        UVar3 = cmprInfo->baseVal;
        uVar18 = ((ulong)inLen << 4) / (ulong)bVar1;
        uVar13 = (ulong)outLen;
        if ((uint)uVar18 < outLen) {
          uVar13 = uVar18 & 0xffffffff;
        }
        psVar16 = (short *)(outData + uVar13);
        if (UVar2 != '\x01') {
          if (UVar2 != '\0') {
            return '\0';
          }
          uVar17 = 0;
          for (; uVar6 = 0, outData < psVar16; outData = (UINT8 *)((long)outData + 2)) {
            sVar12 = 0;
            for (uVar20 = uVar19; uVar20 != 0; uVar20 = uVar20 - uVar11) {
              uVar11 = 8;
              if (uVar20 < 8) {
                uVar11 = uVar20;
              }
              uVar17 = uVar17 + uVar11;
              uVar22 = (uint)*inData << ((byte)uVar17 & 0x1f);
              if (7 < uVar17) {
                inData = inData + 1;
                uVar17 = uVar17 - 8;
                if (uVar17 == 0) {
                  uVar17 = 0;
                }
                else {
                  uVar22 = uVar22 | (uint)*inData << ((byte)uVar17 & 0x1f);
                }
              }
              bVar8 = (byte)sVar12;
              sVar12 = sVar12 + uVar11;
              uVar6 = uVar6 | (~(-1 << ((byte)uVar11 & 0x1f)) & 0xffffU & uVar22 >> 8) <<
                              (bVar8 & 0x1f);
            }
            *(UINT16 *)outData = (short)uVar6 + UVar3;
          }
          return '\0';
        }
        uVar17 = 0;
        for (; uVar6 = 0, outData < psVar16; outData = (UINT8 *)((long)outData + 2)) {
          sVar12 = 0;
          for (uVar20 = uVar19; uVar20 != 0; uVar20 = uVar20 - uVar11) {
            uVar11 = 8;
            if (uVar20 < 8) {
              uVar11 = uVar20;
            }
            uVar17 = uVar17 + uVar11;
            uVar22 = (uint)*inData << ((byte)uVar17 & 0x1f);
            if (7 < uVar17) {
              inData = inData + 1;
              uVar17 = uVar17 - 8;
              if (uVar17 == 0) {
                uVar17 = 0;
              }
              else {
                uVar22 = uVar22 | (uint)*inData << ((byte)uVar17 & 0x1f);
              }
            }
            bVar9 = (byte)sVar12;
            sVar12 = sVar12 + uVar11;
            uVar6 = uVar6 | (~(-1 << ((byte)uVar11 & 0x1f)) & 0xffffU & uVar22 >> 8) <<
                            (bVar9 & 0x1f);
          }
          *(UINT16 *)outData = (short)(uVar6 << (bVar8 - bVar1 & 0x1f)) + UVar3;
        }
        return '\0';
      }
      pPVar4 = cmprInfo->comprTbl;
      if (pPVar4->valueCount != 0) {
        if (bVar8 != pPVar4->bitsDec) {
          return '\x11';
        }
        if (bVar1 != pPVar4->bitsCmp) {
          return '\x11';
        }
        pUVar15 = (pPVar4->values).d8;
        uVar17 = 0;
        uVar18 = ((ulong)inLen << 4) / (ulong)bVar1;
        uVar13 = (ulong)outLen;
        if ((uint)uVar18 < outLen) {
          uVar13 = uVar18 & 0xffffffff;
        }
        pUVar14 = outData + uVar13;
        for (; uVar18 = 0, outData < pUVar14; outData = outData + 2) {
          sVar12 = 0;
          for (uVar20 = uVar19; uVar20 != 0; uVar20 = uVar20 - uVar11) {
            uVar11 = 8;
            if (uVar20 < 8) {
              uVar11 = uVar20;
            }
            uVar17 = uVar17 + uVar11;
            uVar6 = (uint)*inData << ((byte)uVar17 & 0x1f);
            if (7 < uVar17) {
              inData = inData + 1;
              uVar17 = uVar17 - 8;
              if (uVar17 == 0) {
                uVar17 = 0;
              }
              else {
                uVar6 = uVar6 | (uint)*inData << ((byte)uVar17 & 0x1f);
              }
            }
            bVar8 = (byte)sVar12;
            sVar12 = sVar12 + uVar11;
            uVar18 = (ulong)((uint)uVar18 |
                            (~(-1 << ((byte)uVar11 & 0x1f)) & 0xffffU & uVar6 >> 8) <<
                            (bVar8 & 0x1f));
          }
          *(undefined2 *)outData = *(undefined2 *)(pUVar15 + uVar18 * 2);
        }
        return '\0';
      }
    }
    else {
      if (uVar6 != 1) {
        return ' ';
      }
      bVar1 = cmprInfo->bitsCmp;
      uVar19 = (ushort)bVar1;
      UVar2 = cmprInfo->subType;
      if (UVar2 != '\x02') {
        uVar18 = ((ulong)inLen << 3) / (ulong)bVar1;
        uVar13 = (ulong)outLen;
        if ((uint)uVar18 < outLen) {
          uVar13 = uVar18;
        }
        pUVar15 = outData + (uVar13 & 0xffffffff);
        cVar5 = (char)cmprInfo->baseVal;
        if (UVar2 != '\x01') {
          if (UVar2 != '\0') {
            return '\0';
          }
          uVar17 = 0;
          for (; sVar12 = 0, outData < pUVar15; outData = outData + 1) {
            uVar6 = 0;
            for (uVar20 = uVar19; uVar20 != 0; uVar20 = uVar20 - uVar11) {
              uVar11 = 8;
              if (uVar20 < 8) {
                uVar11 = uVar20;
              }
              uVar17 = uVar17 + uVar11;
              uVar22 = (uint)*inData << ((byte)uVar17 & 0x1f);
              if (7 < uVar17) {
                inData = inData + 1;
                uVar17 = uVar17 - 8;
                if (uVar17 == 0) {
                  uVar17 = 0;
                }
                else {
                  uVar22 = uVar22 | (uint)*inData << ((byte)uVar17 & 0x1f);
                }
              }
              bVar8 = (byte)sVar12;
              sVar12 = sVar12 + uVar11;
              uVar6 = uVar6 | (~(-1 << ((byte)uVar11 & 0x1f)) & uVar22 >> 8) << (bVar8 & 0x1f);
            }
            *outData = (char)uVar6 + cVar5;
          }
          return '\0';
        }
        uVar17 = 0;
        for (; sVar12 = 0, outData < pUVar15; outData = outData + 1) {
          uVar6 = 0;
          for (uVar20 = uVar19; uVar20 != 0; uVar20 = uVar20 - uVar11) {
            uVar11 = 8;
            if (uVar20 < 8) {
              uVar11 = uVar20;
            }
            uVar17 = uVar17 + uVar11;
            uVar22 = (uint)*inData << ((byte)uVar17 & 0x1f);
            if (7 < uVar17) {
              inData = inData + 1;
              uVar17 = uVar17 - 8;
              if (uVar17 == 0) {
                uVar17 = 0;
              }
              else {
                uVar22 = uVar22 | (uint)*inData << ((byte)uVar17 & 0x1f);
              }
            }
            bVar9 = (byte)sVar12;
            sVar12 = sVar12 + uVar11;
            uVar6 = uVar6 | (~(-1 << ((byte)uVar11 & 0x1f)) & uVar22 >> 8) << (bVar9 & 0x1f);
          }
          *outData = (char)(uVar6 << (bVar8 - bVar1 & 0x1f)) + cVar5;
        }
        return '\0';
      }
      pPVar4 = cmprInfo->comprTbl;
      if (pPVar4->valueCount != 0) {
        if (bVar8 != pPVar4->bitsDec) {
          return '\x11';
        }
        if (bVar1 != pPVar4->bitsCmp) {
          return '\x11';
        }
        pUVar15 = (pPVar4->values).d8;
        uVar17 = 0;
        uVar18 = ((ulong)inLen << 3) / (ulong)bVar1;
        uVar13 = (ulong)outLen;
        if ((uint)uVar18 < outLen) {
          uVar13 = uVar18 & 0xffffffff;
        }
        pUVar14 = outData + uVar13;
        for (; sVar12 = 0, outData < pUVar14; outData = outData + 1) {
          uVar18 = 0;
          for (uVar20 = uVar19; uVar20 != 0; uVar20 = uVar20 - uVar11) {
            uVar11 = 8;
            if (uVar20 < 8) {
              uVar11 = uVar20;
            }
            uVar17 = uVar17 + uVar11;
            uVar6 = (uint)*inData << ((byte)uVar17 & 0x1f);
            if (7 < uVar17) {
              inData = inData + 1;
              uVar17 = uVar17 - 8;
              if (uVar17 == 0) {
                uVar17 = 0;
              }
              else {
                uVar6 = uVar6 | (uint)*inData << ((byte)uVar17 & 0x1f);
              }
            }
            bVar8 = (byte)sVar12;
            sVar12 = sVar12 + uVar11;
            uVar18 = (ulong)((uint)uVar18 |
                            (~(-1 << ((byte)uVar11 & 0x1f)) & uVar6 >> 8) << (bVar8 & 0x1f));
          }
          *outData = pUVar15[uVar18 & 0xffff];
        }
        return '\0';
      }
    }
  }
  return '\x10';
}

Assistant:

UINT8 DecompressDataBlk(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmprInfo)
{
	UINT8 valSize;
	UINT8 retVal;
	
	switch(cmprInfo->comprType)
	{
	case 0x00:	// Bit Packing compression
		valSize = (cmprInfo->bitsDec + 7) / 8;
		if (valSize == 0x01)
			retVal = Decompress_BitPacking_8(outLen, outData, inLen, inData, cmprInfo);
		else if (valSize == 0x02)
			retVal = Decompress_BitPacking_16(outLen, outData, inLen, inData, cmprInfo);
		else
			retVal = 0x20;	// invalid number of decompressed bits
		if (retVal)
			return retVal;
		break;
	case 0x01:	// Delta-PCM
		valSize = (cmprInfo->bitsDec + 7) / 8;
		if (valSize == 0x01)
			retVal = Decompress_DPCM_8(outLen, outData, inLen, inData, cmprInfo);
		else if (valSize == 0x02)
			retVal = Decompress_DPCM_16(outLen, outData, inLen, inData, cmprInfo);
		else
			retVal = 0x20;	// invalid number of decompressed bits
		if (retVal)
			return retVal;
		break;
	default:
		return 0x80;
	}
	
	return 0x00;
}